

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPrePartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  int i;
  ulong uVar17;
  ulong uVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  long lVar22;
  float *pfVar23;
  float *pfVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float *local_b0;
  float *local_a8;
  float *local_a0;
  float *local_80;
  float *local_78;
  
  uVar4 = this->kStateCount;
  iVar5 = this->kPartialsSize;
  for (lVar13 = 0; (long)iVar5 * 4 != lVar13; lVar13 = lVar13 + 4) {
    *(undefined4 *)((long)destP + lVar13) = 0;
  }
  uVar6 = this->kCategoryCount;
  iVar5 = this->kPartialsPaddedStateCount;
  iVar7 = this->kPatternCount;
  iVar8 = this->kMatrixSize;
  iVar9 = uVar4 + 1;
  lVar13 = (long)((int)uVar4 / 4 << 2);
  iVar11 = iVar5 * startPattern;
  local_78 = matrices2 + 2;
  local_80 = matrices1 + 3;
  local_b0 = matrices1;
  local_a8 = matrices2;
  for (uVar18 = 0; uVar18 != (~((int)uVar6 >> 0x1f) & uVar6); uVar18 = uVar18 + 1) {
    pfVar24 = partials2 + iVar11;
    iVar12 = (iVar7 * (int)uVar18 + startPattern) * iVar5;
    pfVar19 = destP + iVar12;
    local_a0 = partials1 + iVar12;
    for (iVar12 = startPattern; iVar12 < endPattern; iVar12 = iVar12 + 1) {
      pfVar10 = local_b0;
      pfVar16 = local_a8;
      pfVar21 = local_78;
      pfVar23 = local_80;
      for (uVar17 = 0; uVar17 != (~((int)uVar4 >> 0x1f) & uVar4); uVar17 = uVar17 + 1) {
        auVar25 = ZEXT816(0) << 0x40;
        lVar14 = 0;
        pfVar15 = pfVar24;
        pfVar20 = pfVar16;
        while (auVar26 = auVar25, lVar14 < lVar13) {
          auVar26._8_8_ = 0;
          auVar26._0_8_ = *(ulong *)(pfVar21 + lVar14 + -2);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(pfVar24 + lVar14);
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(pfVar21 + lVar14);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = *(ulong *)(pfVar24 + lVar14 + 2);
          lVar14 = lVar14 + 4;
          pfVar15 = pfVar15 + 4;
          pfVar20 = pfVar20 + 4;
          auVar25 = vfmadd213ps_fma(auVar28,auVar26,auVar25);
          auVar25 = vfmadd231ps_fma(auVar25,auVar27,auVar29);
        }
        while (lVar14 < (int)uVar4) {
          fVar2 = *pfVar20;
          lVar14 = lVar14 + 1;
          pfVar20 = pfVar20 + 1;
          auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)fVar2),ZEXT416((uint)*pfVar15));
          pfVar15 = pfVar15 + 1;
        }
        auVar25 = vmovshdup_avx(auVar25);
        lVar14 = 0;
        fVar2 = (auVar25._0_4_ + auVar26._0_4_) * local_a0[uVar17];
        pfVar15 = pfVar10;
        pfVar20 = pfVar19;
        while (lVar14 < lVar13) {
          pfVar15 = pfVar15 + 4;
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)pfVar23[lVar14 + -3]),ZEXT416((uint)fVar2),
                                    ZEXT416((uint)*pfVar20));
          *pfVar20 = auVar25._0_4_;
          auVar26 = ZEXT416((uint)fVar2);
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)pfVar23[lVar14 + -2]),auVar26,
                                    ZEXT416((uint)pfVar20[1]));
          pfVar20[1] = auVar25._0_4_;
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)pfVar23[lVar14 + -1]),auVar26,
                                    ZEXT416((uint)pfVar20[2]));
          pfVar20[2] = auVar25._0_4_;
          pfVar1 = pfVar23 + lVar14;
          lVar14 = lVar14 + 4;
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)*pfVar1),auVar26,ZEXT416((uint)pfVar20[3]));
          pfVar20[3] = auVar25._0_4_;
          pfVar20 = pfVar20 + 4;
        }
        for (lVar22 = 0; lVar14 + lVar22 < (long)(int)uVar4; lVar22 = lVar22 + 1) {
          fVar3 = *pfVar15;
          pfVar15 = pfVar15 + 1;
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)fVar3),ZEXT416((uint)fVar2),
                                    ZEXT416((uint)pfVar20[lVar22]));
          pfVar20[lVar22] = auVar25._0_4_;
        }
        pfVar21 = pfVar21 + iVar9;
        pfVar16 = pfVar16 + iVar9;
        pfVar23 = pfVar23 + iVar9;
        pfVar10 = pfVar10 + iVar9;
      }
      pfVar24 = pfVar24 + iVar5;
      local_a0 = local_a0 + iVar5;
      pfVar19 = pfVar19 + iVar5;
    }
    iVar11 = iVar11 + iVar7 * iVar5;
    local_78 = local_78 + iVar8;
    local_a8 = local_a8 + iVar8;
    local_80 = local_80 + iVar8;
    local_b0 = local_b0 + iVar8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsPartials(REALTYPE* destP,
                                                                const REALTYPE* partials1,
                                                                const REALTYPE* matrices1,
                                                                const REALTYPE* partials2,
                                                                const REALTYPE* matrices2,
                                                                int startPattern,
                                                                int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum2A = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                // sum2A + sum2B = M_j P_j
                // Now 2nd loop
                tmpdestPtr = destPtr;
                REALTYPE  MjPj = (sum2A + sum2B) * partials1Ptr[i];

                for (j = 0; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }

}